

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::Regexp::Decref(Regexp *this)

{
  int iVar1;
  mapped_type *pmVar2;
  Regexp *local_48;
  Regexp *local_40 [3];
  Regexp *local_28;
  int local_1c;
  int r;
  MutexLock l;
  Regexp *this_local;
  
  l.mu_ = (Mutex *)this;
  if (this->ref_ == 0xffff) {
    MutexLock::MutexLock((MutexLock *)&stack0xffffffffffffffe8,ref_mutex);
    local_28 = this;
    pmVar2 = std::
             map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
             ::operator[](ref_map,&local_28);
    iVar1 = *pmVar2 + -1;
    local_1c = iVar1;
    if (iVar1 < 0xffff) {
      local_1c._0_2_ = (uint16)iVar1;
      this->ref_ = (uint16)local_1c;
      local_40[0] = this;
      std::
      map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
      ::erase(ref_map,local_40);
    }
    else {
      local_48 = this;
      pmVar2 = std::
               map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
               ::operator[](ref_map,&local_48);
      *pmVar2 = iVar1;
    }
    MutexLock::~MutexLock((MutexLock *)&stack0xffffffffffffffe8);
  }
  else {
    this->ref_ = this->ref_ - 1;
    if (this->ref_ == 0) {
      Destroy(this);
    }
  }
  return;
}

Assistant:

void Regexp::Decref() {
  if (ref_ == kMaxRef) {
    // Ref count is stored in overflow map.
    MutexLock l(ref_mutex);
    int r = (*ref_map)[this] - 1;
    if (r < kMaxRef) {
      ref_ = static_cast<uint16>(r);
      ref_map->erase(this);
    } else {
      (*ref_map)[this] = r;
    }
    return;
  }
  ref_--;
  if (ref_ == 0)
    Destroy();
}